

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

_Bool borg_flow_kill(_Bool viewable,wchar_t nearness)

{
  long lVar1;
  wchar_t y;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  loc_conflict grid1;
  bool bVar5;
  chunk_conflict *c;
  _Bool _Var6;
  ushort uVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  loc_conflict grid2;
  loc grid;
  bool bVar10;
  uint uVar11;
  wchar_t wVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  byte bVar16;
  borg_kill *pbVar17;
  long lVar18;
  wchar_t wVar19;
  ulong uVar20;
  long lVar21;
  wchar_t b_stair;
  ulong uVar22;
  
  if ((borg_kills_cnt != 0) &&
     (((borg.trait[0x69] != 0 || (0x13 < borg.trait[0x23])) || (borg_cfg[0x18] != 0)))) {
    if ((borg.trait[0x19] == 4) || (borg.trait[0x19] == 1)) {
      iVar15 = 0x23;
      if (borg.trait[0x69] == 0) {
        iVar15 = 0x19;
      }
      if (borg.trait[0x23] < iVar15) {
        return false;
      }
    }
    if (((borg.trait[0x6d] == 0) && (borg.trait[0x6c] == 0)) &&
       ((borg.trait[0x27] != 0 && (!borg_morgoth_position)))) {
      borg_temp_n = 0;
      bVar16 = 0;
      lVar13 = -1;
      iVar15 = 0;
      do {
        lVar18 = -1;
        do {
          bVar4 = bVar16;
          if ((borg_grids[borg.c.y + lVar18][lVar13 + borg.c.x].glyph != false) ||
             ((byte)(borg_grids[borg.c.y + lVar18][lVar13 + borg.c.x].feat - 0x11) < 6)) {
            iVar15 = iVar15 + 1;
          }
          bVar2 = 4 < iVar15;
          bVar16 = bVar4 | bVar2;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 2);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 2);
      if (track_less.num < 1) {
        b_stair = L'\xffffffff';
        wVar19 = L'\xffffffff';
      }
      else {
        wVar19 = L'\xffffffff';
        uVar20 = 0;
        uVar22 = 0xffffffff;
        do {
          grid2 = loc(track_less.x[uVar20],track_less.y[uVar20]);
          grid1.y = borg.c.y;
          grid1.x = borg.c.x;
          wVar8 = distance(grid1,grid2);
          if (wVar19 < wVar8) {
            uVar22 = uVar20 & 0xffffffff;
          }
          b_stair = (wchar_t)uVar22;
          if (wVar8 < wVar19) {
            wVar8 = wVar19;
          }
          wVar19 = wVar8;
          uVar20 = uVar20 + 1;
        } while ((long)uVar20 < (long)track_less.num);
      }
      if (1 < borg_kills_nxt) {
        lVar13 = 1;
        bVar10 = false;
        do {
          if ((ulong)borg_kills[lVar13].r_idx != 0) {
            pbVar17 = borg_kills + lVar13;
            uVar11 = (pbVar17->pos).x - borg.c.x;
            uVar3 = -uVar11;
            if (0 < (int)uVar11) {
              uVar3 = uVar11;
            }
            uVar14 = (pbVar17->pos).y - borg.c.y;
            uVar11 = -uVar14;
            if (0 < (int)uVar14) {
              uVar11 = uVar14;
            }
            if (uVar11 < uVar3) {
              uVar11 = uVar3;
            }
            if ((((uVar11 != 1) || ((borg.trait[0x71] == 0 && (borg.trait[0xba] == 0)))) &&
                ((borg.goal.ignoring != true ||
                 ((borg.trait[0x71] != 0 ||
                  (_Var6 = flag_has_dbg(r_info[borg_kills[lVar13].r_idx].flags,0xb,0x11,
                                        "r_info[kill->r_idx].flags","RF_MULTIPLY"), !_Var6)))))) &&
               (((9 < borg.trait[0x24] ||
                 (_Var6 = flag_has_dbg(r_info[pbVar17->r_idx].flags,0xb,0x15,
                                       "r_info[kill->r_idx].flags","RF_NEVER_MOVE"), !_Var6)) &&
                (scaryguy_on_level == false)))) {
              uVar7 = pbVar17->r_idx;
              if (borg.trait[0x23] < 10) {
                _Var6 = flag_has_dbg(r_info[uVar7].flags,0xb,0x11,"r_info[kill->r_idx].flags",
                                     "RF_MULTIPLY");
                if (_Var6) goto LAB_0021a245;
                uVar7 = pbVar17->r_idx;
              }
              _Var6 = flag_has_dbg(r_info[uVar7].flags,0xb,1,"r_info[kill->r_idx].flags","RF_UNIQUE"
                                  );
              if (((!_Var6) || (borg.trait[0x69] != 0)) || (4 < borg.trait[0x23])) {
                wVar8 = (pbVar17->pos).x;
                y = (pbVar17->pos).y;
                if (((!viewable) || ((borg_grids[y][wVar8].info & 0x20) != 0)) &&
                   ((wVar9 = borg_danger(y,wVar8,L'\x01',true,false), borg.trait[0x23] < 0x1a ||
                    ((_Var6 = flag_has_dbg(r_info->flags,0xb,1,"r_info->flags","RF_UNIQUE"), _Var6
                     || (wVar9 <= (int)(short)(avoidance - (avoidance >> 0xf)) >> 1)))))) {
                  if (borg.trait[0x23] < 0x10) {
                    if (avoidance / 3 < wVar9) goto LAB_0021a245;
                    if (borg.trait[0x23] < 10 && b_stair != L'\xffffffff') {
                      wVar9 = borg_distance(track_less.y[b_stair],track_less.x[b_stair],y,wVar8);
                      wVar12 = borg.trait[0x23] * 5 + L'\t';
                      if ((wVar19 <= wVar12) && (wVar12 <= wVar9)) goto LAB_0021a245;
                    }
                  }
                  if (((bool)(bVar4 | bVar2)) &&
                     (_Var6 = flag_has_dbg(r_info[pbVar17->r_idx].flags,0xb,5,
                                           "r_info[kill->r_idx].flags","RF_GROUP_AI"), _Var6)) {
                    lVar18 = -1;
                    do {
                      lVar1 = lVar18 + wVar8;
                      lVar21 = -1;
                      do {
                        c = cave;
                        grid = (loc)loc((int)lVar1,y + (int)lVar21);
                        _Var6 = square_in_bounds_fully(c,grid);
                        if (_Var6) {
                          if ((borg_grids[y + lVar21][lVar1].glyph != false) ||
                             ((byte)(borg_grids[y + lVar21][lVar1].feat - 0x11) < 6)) {
                            iVar15 = iVar15 + 1;
                          }
                          bVar10 = (bool)(bVar10 | iVar15 < 4);
                        }
                        lVar21 = lVar21 + 1;
                      } while (lVar21 != 2);
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 2);
                  }
                  if ((uVar11 == 2) && (pbVar17->ranged_attack == '\0')) {
                    _Var6 = flag_has_dbg(r_info[pbVar17->r_idx].flags,0xb,0x15,
                                         "r_info[kill->r_idx].flags","RF_NEVER_MOVE");
                    bVar5 = !bVar10;
                    bVar10 = true;
                    if ((~_Var6 & 1U) == 0 && bVar5) {
LAB_0021a5d3:
                      _Var6 = borg_flow_far_from_stairs(wVar8,y,b_stair);
                      if (!_Var6) {
                        borg_temp_x[borg_temp_n] = (uint8_t)wVar8;
                        borg_temp_y[borg_temp_n] = (uint8_t)y;
                        borg_temp_n = borg_temp_n + 1;
                      }
                      bVar10 = false;
                    }
                  }
                  else {
                    if (!bVar10) goto LAB_0021a5d3;
                    bVar10 = true;
                  }
                }
              }
            }
          }
LAB_0021a245:
          lVar13 = lVar13 + 1;
        } while (lVar13 < borg_kills_nxt);
      }
      if (borg_temp_n != 0) {
        borg_flow_clear();
        if (0 < borg_temp_n) {
          lVar13 = 0;
          do {
            borg_flow_enqueue_grid((uint)borg_temp_y[lVar13],(uint)borg_temp_x[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar13 < borg_temp_n);
        }
        borg_flow_spread(nearness,true,!viewable,false,L'\xffffffff',false);
        _Var6 = borg_flow_commit("kill",L'\x01');
        if (_Var6) {
          _Var6 = borg_flow_old(L'\x01');
          return _Var6;
        }
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_kill(bool viewable, int nearness)
{
    int i, x, y, p, j, b_j = -1;
    int b_stair       = -1;

    bool borg_in_hall = false;
    int  hall_y, hall_x, hall_walls = 0;
    bool skip_monster = false;

    borg_grid *ag;

    /* Efficiency -- Nothing to kill */
    if (!borg_kills_cnt)
        return false;

    /* Don't chase down town monsters when you are just starting out */
    if (borg.trait[BI_CDEPTH] == 0 && borg.trait[BI_CLEVEL] < 20
        && !borg_cfg[BORG_MONEY_SCUM_AMOUNT])
        return false;

    /* YOU ARE NOT A WARRIOR!! DON'T ACT LIKE ONE!! */
    if ((borg.trait[BI_CLASS] == CLASS_MAGE
            || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
        && borg.trait[BI_CLEVEL] < (borg.trait[BI_CDEPTH] ? 35 : 25))
        return false;

    /* Not if Weak from hunger or no food */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK]
        || borg.trait[BI_FOOD] == 0)
        return false;

    /* Not if sitting in a sea of runes */
    if (borg_morgoth_position)
        return false;

    /* Nothing found */
    borg_temp_n = 0;

    /* check to see if in a hall, used later */
    for (hall_x = -1; hall_x <= 1; hall_x++) {
        for (hall_y = -1; hall_y <= 1; hall_y++) {
            /* Acquire location */
            x  = hall_x + borg.c.x;
            y  = hall_y + borg.c.y;

            ag = &borg_grids[y][x];

            /* track walls */
            if ((ag->glyph)
                || ((ag->feat >= FEAT_MAGMA) && (ag->feat <= FEAT_PERM))) {
                hall_walls++;
            }

            /* addem up */
            if (hall_walls >= 5)
                borg_in_hall = true;
        }
    }

    /* Check distance away from stairs, used later */

    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Scan the monster list */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill = &borg_kills[i];
        int        x9   = kill->pos.x;
        int        y9   = kill->pos.y;
        int        ax, ay, d;

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Distance components */
        ax = (x9 > borg.c.x) ? (x9 - borg.c.x) : (borg.c.x - x9);
        ay = (y9 > borg.c.y) ? (y9 - borg.c.y) : (borg.c.y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* don't bother flowing to an adjacent monster when I am afraid */
        if (d == 1 && (borg.trait[BI_ISAFRAID] || borg.trait[BI_CRSFEAR]))
            continue;

        /* Ignore multiplying monsters */
        if (borg.goal.ignoring && !borg.trait[BI_ISAFRAID]
            && (rf_has(r_info[kill->r_idx].flags, RF_MULTIPLY)))
            continue;

        /* Ignore molds when low level */
        if (borg.trait[BI_MAXCLEVEL] < 10
            && (rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE)))
            continue;

        /* Avoid flowing to a fight if a scary guy is on the level */
        if (scaryguy_on_level)
            continue;

        /* Avoid multiplying monsters when low level */
        if (borg.trait[BI_CLEVEL] < 10
            && (rf_has(r_info[kill->r_idx].flags, RF_MULTIPLY)))
            continue;

        /* Hack -- ignore Maggot until later.  Player will chase Maggot
         * down all across the screen waking up all the monsters.  Then
         * he is stuck in a compromised situation.
         */
        if ((rf_has(r_info[kill->r_idx].flags, RF_UNIQUE))
            && borg.trait[BI_CDEPTH] == 0 && borg.trait[BI_CLEVEL] < 5)
            continue;

        /* Access the location */
        x = kill->pos.x;
        y = kill->pos.y;

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* Calculate danger */
        p = borg_danger(y, x, 1, true, false);

        /* Hack -- Skip "deadly" monsters unless uniques*/
        if (borg.trait[BI_CLEVEL] > 25 && (!rf_has(r_info->flags, RF_UNIQUE))
            && p > avoidance / 2)
            continue;
        if (borg.trait[BI_CLEVEL] <= 15 && p > avoidance / 3)
            continue;

        /* Skip ones that make me wander too far */
        if (b_stair != -1 && borg.trait[BI_CLEVEL] < 10) {
            /* Check the distance of this monster to the stair */
            j = borg_distance(
                track_less.y[b_stair], track_less.x[b_stair], y, x);
            /* skip far away monsters while I am close to stair */
            if (b_j <= borg.trait[BI_CLEVEL] * 5 + 9
                && j >= borg.trait[BI_CLEVEL] * 5 + 9)
                continue;
        }

        /* Hack -- Avoid getting surrounded */
        if (borg_in_hall && (rf_has(r_info[kill->r_idx].flags, RF_GROUP_AI))) {
            /* check to see if monster is in a hall, */
            for (hall_x = -1; hall_x <= 1; hall_x++) {
                for (hall_y = -1; hall_y <= 1; hall_y++) {
                    if (!square_in_bounds_fully(
                            cave, loc(hall_x + x, hall_y + y)))
                        continue;
                    ag = &borg_grids[hall_y + y][hall_x + x];

                    /* track walls */
                    if ((ag->glyph)
                        || ((ag->feat >= FEAT_MAGMA)
                            && (ag->feat <= FEAT_PERM))) {
                        hall_walls++;
                    }

                    /* we want the monster to be in a hall also
                     *
                     *  ########################
                     *  ############      S  ###
                     *  #         @'     SSS ###
                     *  # ##########       SS###
                     *  # #        #       Ss###
                     *  # #        ###### ######
                     *  # #             # #
                     * Currently, we would like the borg to avoid
                     * flowing to a situation like the one above.
                     * We would like him to stay in the hall and
                     * attack from a distance.  One problem is the
                     * lower case 's' in the corner, He will show
                     * up as being in a corner, and the borg may
                     * flow to it.  Let's hope that is a rare case.
                     *
                     * The borg might flow to the 'dark' south exit
                     * of the room.  This would be dangerous for
                     * him as well.
                     */
                    /* add 'em up */
                    if (hall_walls < 4) {
                        /* This monster is not in a hallway.
                         * It may not be safe to fight.
                         */
                        skip_monster = true;
                    }
                }
            }
        }

        /* Skip this one if it is just 2 grids from me and it can attack me as
         * soon as I move 1 grid closer to it.  Note that some monsters are
         * faster than me and it could still cover the 1 grid and hit me. I'll
         * fix it (based on my speed) later XXX
         */
        if (d == 2 && /* Spacing is important */
            (!(kill->ranged_attack)) && /* Ranged Attacks, don't rest. */
            (!(rf_has(r_info[kill->r_idx].flags,
                RF_NEVER_MOVE)))) /* Skip monsters that dont chase */
        {
            skip_monster = true;
        }

        /* skip certain ones */
        if (skip_monster)
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to kill */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to kill */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward monsters that we can see, make sure they */
    /* are at least easily reachable.  The second flag is whether or not */
    /* to avoid unknown squares.  This was for performance when we have ESP. */
    borg_flow_spread(nearness, true, !viewable, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("kill", GOAL_KILL))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_KILL))
        return false;

    /* Success */
    return true;
}